

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>
        *alloc)

{
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar1;
  size_t sVar2;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    poVar1 = this->ptr;
    sVar2 = count;
    do {
      poVar1->set = value->set;
      if (value->set == true) {
        (poVar1->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        (poVar1->optionalValue).__align = (value->optionalValue).__align;
        *(undefined8 *)((long)&poVar1->optionalValue + 8) =
             *(undefined8 *)((long)&value->optionalValue + 8);
      }
      poVar1 = poVar1 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }